

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int dump_inserted_event_fn(event_base *base,event *e,void *arg)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  FILE *output;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  
  uVar1 = (e->ev_evcallback).evcb_flags;
  if ((uVar1 & 3) != 0) {
    uVar2 = e->ev_events;
    pcVar7 = " Read";
    if ((uVar2 & 2) == 0) {
      pcVar7 = anon_var_dwarf_6723d3 + 9;
    }
    pcVar8 = " Write";
    if ((uVar2 & 4) == 0) {
      pcVar8 = anon_var_dwarf_6723d3 + 9;
    }
    pcVar9 = " EOF";
    if (-1 < (char)uVar2) {
      pcVar9 = anon_var_dwarf_6723d3 + 9;
    }
    bVar13 = (uVar2 & 8) == 0;
    pcVar5 = "sig";
    if (bVar13) {
      pcVar5 = "fd ";
    }
    pcVar10 = " Signal";
    if (bVar13) {
      pcVar10 = anon_var_dwarf_6723d3 + 9;
    }
    pcVar11 = " Persist";
    if ((uVar2 & 0x10) == 0) {
      pcVar11 = anon_var_dwarf_6723d3 + 9;
    }
    pcVar6 = " ET";
    if ((uVar2 & 0x20) == 0) {
      pcVar6 = anon_var_dwarf_6723d3 + 9;
    }
    pcVar12 = " Internal";
    if ((uVar1 & 0x10) == 0) {
      pcVar12 = anon_var_dwarf_6723d3 + 9;
    }
    fprintf((FILE *)arg,"  %p [%s %d]%s%s%s%s%s%s%s",e,pcVar5,(ulong)(uint)e->ev_fd,pcVar7,pcVar8,
            pcVar9,pcVar10,pcVar11,pcVar6,pcVar12);
    if (((e->ev_evcallback).evcb_flags & 1) != 0) {
      lVar3 = (ulong)((uint)(e->ev_timeout).tv_usec & 0xfffff) + (base->tv_clock_diff).tv_usec;
      uVar4 = (uint)lVar3 + 0xbdc0;
      if (lVar3 < 1000000) {
        uVar4 = (uint)lVar3;
      }
      fprintf((FILE *)arg," Timeout=%ld.%06d",
              (ulong)(999999 < lVar3) + (base->tv_clock_diff).tv_sec + (e->ev_timeout).tv_sec,
              (ulong)(uVar4 & 0xfffff));
    }
    fputc(10,(FILE *)arg);
  }
  return 0;
}

Assistant:

static int
dump_inserted_event_fn(const struct event_base *base, const struct event *e, void *arg)
{
	FILE *output = arg;
	const char *gloss = (e->ev_events & EV_SIGNAL) ?
	    "sig" : "fd ";

	if (! (e->ev_flags & (EVLIST_INSERTED|EVLIST_TIMEOUT)))
		return 0;

	fprintf(output, "  %p [%s "EV_SOCK_FMT"]%s%s%s%s%s%s%s",
	    (void*)e, gloss, EV_SOCK_ARG(e->ev_fd),
	    (e->ev_events&EV_READ)?" Read":"",
	    (e->ev_events&EV_WRITE)?" Write":"",
	    (e->ev_events&EV_CLOSED)?" EOF":"",
	    (e->ev_events&EV_SIGNAL)?" Signal":"",
	    (e->ev_events&EV_PERSIST)?" Persist":"",
	    (e->ev_events&EV_ET)?" ET":"",
	    (e->ev_flags&EVLIST_INTERNAL)?" Internal":"");
	if (e->ev_flags & EVLIST_TIMEOUT) {
		struct timeval tv;
		tv.tv_sec = e->ev_timeout.tv_sec;
		tv.tv_usec = e->ev_timeout.tv_usec & MICROSECONDS_MASK;
		evutil_timeradd(&tv, &base->tv_clock_diff, &tv);
		fprintf(output, " Timeout=%ld.%06d",
		    (long)tv.tv_sec, (int)(tv.tv_usec & MICROSECONDS_MASK));
	}
	fputc('\n', output);

	return 0;
}